

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generator.cc
# Opt level: O2

void __thiscall generator_var_var_slicing_Test::TestBody(generator_var_var_slicing_Test *this)

{
  AssignmentType type;
  Generator *this_00;
  Var *pVVar1;
  Port *pPVar2;
  Port *var;
  undefined1 local_188 [8];
  Context c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  allocator<char> local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  _Alloc_hider local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  
  kratos::Context::Context((Context *)local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffb8,"mod",local_58);
  this_00 = kratos::Context::generator((Context *)local_188,(string *)&stack0xffffffffffffffb8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffb8,"a",local_58);
  pVVar1 = kratos::Generator::var(this_00,(string *)&stack0xffffffffffffffb8,0x10,4);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffb8,"in",local_58);
  pPVar2 = kratos::Generator::port(this_00,In,(string *)&stack0xffffffffffffffb8,2);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffb8,"out",local_58);
  var = kratos::Generator::port(this_00,Out,(string *)&stack0xffffffffffffffb8,0x10);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_58,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pPVar2->super_Var).super_enable_shared_from_this<kratos::Var>);
  type = (*(pVVar1->super_IRNode)._vptr_IRNode[10])(pVVar1,local_58);
  kratos::Var::assign((Var *)&stack0xffffffffffffffb8,&var->super_Var,type);
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)local_48._M_p;
  _Stack_60._M_pi = _Stack_40._M_pi;
  local_48._M_p = (pointer)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  kratos::Generator::add_stmt
            (this_00,(shared_ptr<kratos::Stmt> *)&c.tracked_generators_._M_h._M_single_bucket);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffffc0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  kratos::check_mixed_assignment(this_00);
  kratos::verify_generator_connectivity(this_00);
  kratos::Context::~Context((Context *)local_188);
  return;
}

Assistant:

TEST(generator, var_var_slicing) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto &a = mod.var("a", 16, 4);
    auto &in = mod.port(PortDirection::In, "in", 2);
    auto &out = mod.port(PortDirection::Out, "out", 16);
    mod.add_stmt(out.assign(a[in.shared_from_this()], AssignmentType::Blocking));

    check_mixed_assignment(&mod);
    verify_generator_connectivity(&mod);
}